

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O3

int CreateBloodTranslation(PalEntry color)

{
  byte bVar1;
  byte bVar2;
  BYTE BVar3;
  ulong uVar4;
  FRemapTable *this;
  anon_union_4_2_12391d7c_for_PalEntry_0 aVar5;
  uint uVar6;
  uint r;
  uint g;
  long lVar7;
  
  if (BloodTranslationColors.Count == 0) {
    TArray<FRemapTablePtr,_FRemapTable_*>::Grow
              (&translationtables[8].super_TArray<FRemapTablePtr,_FRemapTable_*>,1);
    translationtables[8].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array
    [translationtables[8].super_TArray<FRemapTablePtr,_FRemapTable_*>.Count].Ptr =
         (FRemapTable *)0x0;
    translationtables[8].super_TArray<FRemapTablePtr,_FRemapTable_*>.Count =
         translationtables[8].super_TArray<FRemapTablePtr,_FRemapTable_*>.Count + 1;
    TArray<PalEntry,_PalEntry>::Grow(&BloodTranslationColors,1);
    BloodTranslationColors.Array[BloodTranslationColors.Count].field_0 =
         (anon_union_4_2_12391d7c_for_PalEntry_0)0x0;
    BloodTranslationColors.Count = BloodTranslationColors.Count + 1;
  }
  if (1 < BloodTranslationColors.Count) {
    uVar4 = 1;
    do {
      if (((BloodTranslationColors.Array[uVar4].field_0.field_0.r == color.field_0._2_1_) &&
          (BloodTranslationColors.Array[uVar4].field_0.field_0.g == color.field_0._1_1_)) &&
         (BloodTranslationColors.Array[uVar4].field_0.field_0.b == color.field_0._0_1_))
      goto LAB_00333842;
      uVar4 = uVar4 + 1;
    } while (BloodTranslationColors.Count != uVar4);
    if (0xfffe < BloodTranslationColors.Count) {
      I_Error("Too many blood colors");
    }
  }
  this = (FRemapTable *)operator_new(0x20);
  this->Inactive = false;
  FRemapTable::Alloc(this,0x100);
  lVar7 = 0;
  do {
    bVar1 = GPalette.BaseColors[lVar7].field_0.field_0.r;
    bVar2 = GPalette.BaseColors[lVar7].field_0.field_0.g;
    if (bVar2 < bVar1) {
      bVar2 = bVar1;
    }
    aVar5.d._1_3_ = 0;
    aVar5.field_0.b = bVar2;
    if (bVar2 <= (*(anon_union_4_2_12391d7c_for_PalEntry_0 *)
                   &GPalette.BaseColors[lVar7].field_0.field_0).b) {
      aVar5.field_0 =
           *(anon_union_4_2_12391d7c_for_PalEntry_0 *)&GPalette.BaseColors[lVar7].field_0.field_0;
    }
    uVar6 = aVar5.d & 0xff;
    r = (((uint)color.field_0 >> 0x10 & 0xff) * uVar6) / 0xff & 0xff;
    g = (((uint)color.field_0 >> 8 & 0xff) * uVar6) / 0xff & 0xff;
    uVar6 = (uVar6 * ((uint)color.field_0 & 0xff)) / 0xff & 0xff;
    BVar3 = FColorMatcher::Pick(&ColorMatcher,r,g,uVar6);
    this->Palette[lVar7].field_0 =
         (anon_union_4_2_12391d7c_for_PalEntry_0)(g << 8 | r << 0x10 | uVar6);
    this->Remap[lVar7] = BVar3;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x100);
  TArray<FRemapTablePtr,_FRemapTable_*>::Grow
            (&translationtables[8].super_TArray<FRemapTablePtr,_FRemapTable_*>,1);
  translationtables[8].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array
  [translationtables[8].super_TArray<FRemapTablePtr,_FRemapTable_*>.Count].Ptr = this;
  translationtables[8].super_TArray<FRemapTablePtr,_FRemapTable_*>.Count =
       translationtables[8].super_TArray<FRemapTablePtr,_FRemapTable_*>.Count + 1;
  TArray<PalEntry,_PalEntry>::Grow(&BloodTranslationColors,1);
  BloodTranslationColors.Array[BloodTranslationColors.Count].field_0.field_0 =
       (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)color.field_0;
  uVar4 = (ulong)BloodTranslationColors.Count;
  BloodTranslationColors.Count = BloodTranslationColors.Count + 1;
LAB_00333842:
  return (int)uVar4;
}

Assistant:

int CreateBloodTranslation(PalEntry color)
{
	unsigned int i;

	if (BloodTranslationColors.Size() == 0)
	{
		// Don't use the first slot.
		translationtables[TRANSLATION_Blood].Push(NULL);
		BloodTranslationColors.Push(0);
	}

	for (i = 1; i < BloodTranslationColors.Size(); i++)
	{
		if (color.r == BloodTranslationColors[i].r &&
			color.g == BloodTranslationColors[i].g &&
			color.b == BloodTranslationColors[i].b)
		{
			// A duplicate of this translation already exists
			return i;
		}
	}
	if (BloodTranslationColors.Size() >= MAX_DECORATE_TRANSLATIONS)
	{
		I_Error("Too many blood colors");
	}
	FRemapTable *trans = new FRemapTable;
	for (i = 0; i < 256; i++)
	{
		int bright = MAX(MAX(GPalette.BaseColors[i].r, GPalette.BaseColors[i].g), GPalette.BaseColors[i].b);
		PalEntry pe = PalEntry(color.r*bright/255, color.g*bright/255, color.b*bright/255);
		int entry = ColorMatcher.Pick(pe.r, pe.g, pe.b);

		trans->Palette[i] = pe;
		trans->Remap[i] = entry;
	}
	translationtables[TRANSLATION_Blood].Push(trans);
	return BloodTranslationColors.Push(color);
}